

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

LazyObject * __thiscall Assimp::STEP::DB::MustGetObject(DB *this,uint64_t id)

{
  _Base_ptr p_Var1;
  TypeError *this_00;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  string local_40;
  
  p_Var2 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var3 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var1 = &p_Var3->_M_header;
    do {
      if (*(ulong *)(p_Var2 + 1) >= id) {
        p_Var1 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < id];
    } while (p_Var2 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var1 != p_Var3) && (*(ulong *)(p_Var1 + 1) <= id)) &&
       ((LazyObject *)p_Var1[1]._M_parent != (LazyObject *)0x0)) {
      return (LazyObject *)p_Var1[1]._M_parent;
    }
  }
  this_00 = (TypeError *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"requested entity is not present","");
  TypeError::TypeError(this_00,&local_40,id,0xffffffffffffffff);
  __cxa_throw(this_00,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const LazyObject& MustGetObject(uint64_t id) const {
            const LazyObject* o = GetObject(id);
            if (!o) {
                throw TypeError("requested entity is not present",id);
            }
            return *o;
        }